

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

int Prs_ManErrorPrint(Prs_Man_t *p)

{
  uint local_24;
  char *pcStack_20;
  int iLine;
  char *pThis;
  Prs_Man_t *p_local;
  
  local_24 = 0;
  if (p->ErrorStr[0] == '\0') {
    p_local._4_4_ = 1;
  }
  else {
    for (pcStack_20 = p->pBuffer; pcStack_20 < p->pCur; pcStack_20 = pcStack_20 + 1) {
      local_24 = (*pcStack_20 == '\n') + local_24;
    }
    printf("Line %d: %s\n",(ulong)local_24,p->ErrorStr);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static inline int Prs_ManErrorPrint( Prs_Man_t * p )
{
    char * pThis; int iLine = 0;
    if ( !p->ErrorStr[0] ) return 1;
    for ( pThis = p->pBuffer; pThis < p->pCur; pThis++ )
        iLine += (int)(*pThis == '\n');
    printf( "Line %d: %s\n", iLine, p->ErrorStr );
    return 0;
}